

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9150.cpp
# Opt level: O0

bool __thiscall RTIMUMPU9150::setAccelFsr(RTIMUMPU9150 *this,uchar fsr)

{
  uchar fsr_local;
  RTIMUMPU9150 *this_local;
  
  switch(fsr) {
  case '\0':
    this->m_accelFsr = fsr;
    this->m_accelScale = 6.1035156e-05;
    this_local._7_1_ = true;
    break;
  default:
    fprintf(_stderr,"Illegal MPU9150 accel fsr %d\n",(ulong)fsr);
    this_local._7_1_ = false;
    break;
  case '\b':
    this->m_accelFsr = fsr;
    this->m_accelScale = 0.00012207031;
    this_local._7_1_ = true;
    break;
  case '\x10':
    this->m_accelFsr = fsr;
    this->m_accelScale = 0.00024414062;
    this_local._7_1_ = true;
    break;
  case '\x18':
    this->m_accelFsr = fsr;
    this->m_accelScale = 0.00048828125;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUMPU9150::setAccelFsr(unsigned char fsr)
{
    switch (fsr) {
    case MPU9150_ACCELFSR_2:
        m_accelFsr = fsr;
        m_accelScale = 1.0/16384.0;
        return true;

    case MPU9150_ACCELFSR_4:
        m_accelFsr = fsr;
        m_accelScale = 1.0/8192.0;
        return true;

    case MPU9150_ACCELFSR_8:
        m_accelFsr = fsr;
        m_accelScale = 1.0/4096.0;
        return true;

    case MPU9150_ACCELFSR_16:
        m_accelFsr = fsr;
        m_accelScale = 1.0/2048.0;
        return true;

    default:
        HAL_ERROR1("Illegal MPU9150 accel fsr %d\n", fsr);
        return false;
    }
}